

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O0

void create_netconfig(CVmMainClientIfc *clientifc,TadsNetConfig **netconfig,char **argv)

{
  TadsNetConfig *this;
  FILE *__stream;
  char *pcVar1;
  long *in_RSI;
  long *in_RDI;
  char *msg;
  osfildef *fp;
  char confpath [4096];
  char confname [4096];
  char *in_stack_ffffffffffffdfb8;
  size_t in_stack_ffffffffffffdfc8;
  char *in_stack_ffffffffffffdfd0;
  int in_stack_ffffffffffffe05c;
  char *in_stack_ffffffffffffe060;
  size_t in_stack_ffffffffffffe068;
  char *in_stack_ffffffffffffe070;
  char local_1028 [4120];
  long *local_10;
  long *local_8;
  
  if (*in_RSI == 0) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    this = (TadsNetConfig *)operator_new(0x10);
    TadsNetConfig::TadsNetConfig(this);
    *local_10 = (long)this;
    os_get_special_path(in_stack_ffffffffffffe070,in_stack_ffffffffffffe068,
                        in_stack_ffffffffffffe060,in_stack_ffffffffffffe05c);
    pcVar1 = "tadsweb.config";
    os_build_full_path(in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8,(char *)this,
                       in_stack_ffffffffffffdfb8);
    __stream = fopen(local_1028,"rb");
    if (__stream == (FILE *)0x0) {
      pcVar1 = t3sprintf_alloc("Warning: -webhost mode specified, but couldn\'t read web configuration file \"%s\""
                               ,local_1028);
      (**(code **)(*local_8 + 0x50))(local_8,0,0,pcVar1,0);
      free(pcVar1);
    }
    else {
      TadsNetConfig::read((TadsNetConfig *)*local_10,(int)__stream,local_8,(size_t)pcVar1);
      fclose(__stream);
    }
  }
  return;
}

Assistant:

static void create_netconfig(
    CVmMainClientIfc *clientifc, TadsNetConfig *&netconfig, char **argv)
{
    if (netconfig == 0)
    {
        /* create the object */
        netconfig = new TadsNetConfig();

        /* build the path to the web config file */
        char confname[OSFNMAX], confpath[OSFNMAX];
        os_get_special_path(confpath, sizeof(confpath), argv[0],
                            OS_GSP_T3_SYSCONFIG);
        os_build_full_path(confname, sizeof(confname),
                           confpath, "tadsweb.config");
        
        /* if there's a net configuration file, read it */
        osfildef *fp = osfoprb(confname, OSFTTEXT);
        if (fp != 0)
        {
            /* read the file into the configuration object */
            netconfig->read(fp, clientifc);
            
            /* done with the file */
            osfcls(fp);
        }
        else
        {
            /* warn that the file is missing */
            char *msg = t3sprintf_alloc(
                "Warning: -webhost mode specified, but couldn't "
                "read web configuration file \"%s\"", confname);
            clientifc->display_error(0, 0, msg, FALSE);
            t3free(msg);
        }
    }
}